

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# room-words.h
# Opt level: O3

shared_ptr<RoomBase> __thiscall RoomWords::getBash(RoomWords *this,Parameters *parameters)

{
  pointer pcVar1;
  double dVar2;
  undefined8 *puVar3;
  long lVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  undefined1 auVar5 [16];
  shared_ptr<RoomBase> sVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  puVar3 = (undefined8 *)operator_new(0xf0);
  puVar3[1] = 0x100000001;
  *puVar3 = &PTR___Sp_counted_ptr_inplace_001129c8;
  puVar3[3] = 0;
  puVar3[4] = 0;
  puVar3[5] = 0;
  puVar3[6] = 0;
  puVar3[7] = 0;
  puVar3[4] = puVar3 + 6;
  puVar3[6] = 0x776f6e6b6e755f5f;
  *(undefined4 *)((long)puVar3 + 0x37) = 0x5f5f6e77;
  puVar3[5] = 0xb;
  puVar3[8] = 0;
  puVar3[9] = 0;
  puVar3[10] = 0;
  puVar3[0xb] = 0;
  puVar3[0xc] = 0;
  puVar3[0xd] = 0;
  puVar3[0xe] = 1000;
  puVar3[0xf] = 20000;
  puVar3[0x10] = 0;
  puVar3[0x11] = 0;
  puVar3[0x12] = 0;
  puVar3[0x13] = 0;
  puVar3[0x14] = 0;
  puVar3[0x15] = 0;
  puVar3[0x16] = 0;
  puVar3[0x17] = 0;
  puVar3[0x18] = 0;
  puVar3[0x19] = 0;
  puVar3[0x1a] = 0;
  puVar3[2] = &PTR_generate_00112a40;
  puVar3[0x1d] = 0;
  puVar3[0x1b] = 0;
  puVar3[0x1c] = 0;
  std::__cxx11::string::_M_replace((ulong)(puVar3 + 4),0,(char *)0xb,0x10e61c);
  pcVar1 = (parameters->pathData)._M_dataplus._M_p;
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,pcVar1,pcVar1 + (parameters->pathData)._M_string_length);
  std::__cxx11::string::append((char *)&local_88);
  Dictionary::load((Dictionary *)&local_68,&local_88);
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)puVar3[0x1d];
  puVar3[0x1d] = local_68.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)puVar3[0x1b];
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)puVar3[0x1c];
  puVar3[0x1b] = local_68.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  puVar3[0x1c] = local_68.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  *(undefined4 *)((long)puVar3 + 0x44) = 0x20;
  if ((anonymous_namespace)::timestamp_s()::tStart == '\0') {
    getBash();
  }
  lVar4 = std::chrono::_V2::steady_clock::now();
  sVar6.super___shared_ptr<RoomBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       (lVar4 / 1000000 - anon_unknown.dwarf_10dbb::timestamp_s::tStart);
  auVar5._8_4_ = (int)((ulong)sVar6.super___shared_ptr<RoomBase,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi >> 0x20);
  auVar5._0_8_ = sVar6.super___shared_ptr<RoomBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  auVar5._12_4_ = 0x45300000;
  dVar2 = ((auVar5._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,
                            (int)sVar6.super___shared_ptr<RoomBase,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi) - 4503599627370496.0)) * 0.001;
  puVar3[9] = dVar2;
  puVar3[0xb] = 0x404e000000000000;
  puVar3[10] = dVar2 + -60.0;
  (this->super_RoomBase)._vptr_RoomBase = (_func_int **)(puVar3 + 2);
  *(undefined8 **)&(this->super_RoomBase).id = puVar3;
  sVar6.super___shared_ptr<RoomBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr = &this->super_RoomBase;
  return (shared_ptr<RoomBase>)sVar6.super___shared_ptr<RoomBase,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static std::shared_ptr<RoomBase> getBash(Parameters parameters) {
        auto result = std::make_shared<RoomWords>();

        result->mode = Standard;
        result->name = "Bash";
        result->dictionary = Dictionary::load(parameters.pathData + "words_bash.txt");
        result->poolSize = 32;
        result->tCreated_s = timestamp_s();
        result->tRoundLength_s = 1.0f*60.f;
        result->tRoundStart_s = result->tCreated_s - result->tRoundLength_s;

        return result;
    }